

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

Value * __thiscall
minja::SubscriptExpr::do_evaluate(SubscriptExpr *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  Value *pVVar4;
  Value *pVVar5;
  long lVar6;
  size_t sVar7;
  runtime_error *prVar8;
  element_type *peVar9;
  element_type *__lhs;
  long in_RSI;
  char *pcVar10;
  Value *in_RDI;
  VariableExpr *t;
  Value index_value;
  long i;
  string s;
  long end;
  long start;
  SliceExpr *slice;
  Value target_value;
  Value *result;
  VariableExpr *in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffffbe0;
  long local_418;
  string *in_stack_fffffffffffffbf8;
  Value *in_stack_fffffffffffffc00;
  vector<minja::Value,_std::allocator<minja::Value>_> *in_stack_fffffffffffffc18;
  Value *in_stack_fffffffffffffc20;
  Value *in_stack_fffffffffffffc30;
  Value *local_3b0;
  string local_320 [39];
  undefined1 local_2f9;
  undefined1 local_2d8 [75];
  undefined1 in_stack_fffffffffffffd73;
  int in_stack_fffffffffffffd74;
  Value *in_stack_fffffffffffffd78;
  shared_ptr<minja::Context> *in_stack_fffffffffffffdb0;
  Expression *in_stack_fffffffffffffdb8;
  string local_228 [32];
  long local_208;
  Value *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined1 local_185;
  undefined4 local_184;
  string local_180 [32];
  string local_160 [39];
  byte local_139;
  Value *local_e8;
  byte local_d9;
  Value *local_88;
  Value *local_80;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x20));
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"SubscriptExpr.base is null");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x30));
  if (bVar1) {
    std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2feef3);
    Expression::evaluate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    pVVar4 = (Value *)std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::get
                                ((__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                                 (in_RSI + 0x30));
    if (pVVar4 == (Value *)0x0) {
      pVVar5 = (Value *)0x0;
    }
    else {
      pVVar5 = (Value *)__dynamic_cast(pVVar4,&Expression::typeinfo,&SliceExpr::typeinfo,0);
    }
    local_80 = pVVar5;
    if (pVVar5 == (Value *)0x0) {
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2ff501);
      Expression::evaluate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      bVar1 = Value::is_null((Value *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0))
      ;
      if (bVar1) {
        peVar9 = std::__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2> *)
                            (in_RSI + 0x20));
        if (peVar9 == (element_type *)0x0) {
          local_418 = 0;
        }
        else {
          local_418 = __dynamic_cast(peVar9,&Expression::typeinfo,&VariableExpr::typeinfo,0);
        }
        local_208 = local_418;
        if (local_418 == 0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          Value::dump_abi_cxx11_
                    (in_stack_fffffffffffffd78,in_stack_fffffffffffffd74,
                     (bool)in_stack_fffffffffffffd73);
          std::operator+((char *)in_stack_fffffffffffffbd8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
          std::operator+(in_stack_fffffffffffffbd8,
                         (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
          std::runtime_error::runtime_error(prVar3,local_320);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_2f9 = 1;
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffffbc8);
        std::operator+((char *)in_stack_fffffffffffffbd8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
        std::operator+(in_stack_fffffffffffffbd8,
                       (char *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
        __lhs = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2ff60c);
        VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffffbc8);
        Value::Value(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        iVar2 = (*__lhs->_vptr_Context[4])(__lhs,local_2d8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)CONCAT17((char)iVar2,in_stack_fffffffffffffbd0));
        std::runtime_error::runtime_error(prVar3,local_228);
        local_2f9 = 0;
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Value::get(pVVar4,pVVar5);
      local_184 = 1;
      Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pVVar5->object_);
      local_d9 = 0;
      if (bVar1) {
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2fefae);
        Expression::evaluate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        local_d9 = 1;
        local_3b0 = (Value *)Value::get<long>(in_stack_fffffffffffffc20);
      }
      else {
        local_3b0 = (Value *)0x0;
      }
      if ((local_d9 & 1) != 0) {
        Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      }
      local_88 = local_3b0;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_80->callable_);
      local_139 = 0;
      if (bVar1) {
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2ff06e);
        Expression::evaluate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
        local_139 = 1;
        pVVar4 = (Value *)Value::get<long>(in_stack_fffffffffffffc20);
      }
      else {
        in_stack_fffffffffffffc30 = (Value *)Value::size(local_3b0);
        pVVar4 = in_stack_fffffffffffffc30;
      }
      pVVar5 = pVVar4;
      if ((local_139 & 1) != 0) {
        Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
      }
      local_e8 = pVVar4;
      bVar1 = Value::is_string((Value *)0x2ff10d);
      if (bVar1) {
        Value::get<std::__cxx11::string>(pVVar5);
        if ((long)local_88 < 0) {
          lVar6 = std::__cxx11::string::size();
          local_88 = (Value *)((long)&(local_88->super_enable_shared_from_this<minja::Value>).
                                      _M_weak_this.
                                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr + lVar6);
        }
        if ((long)local_e8 < 0) {
          lVar6 = std::__cxx11::string::size();
          local_e8 = (Value *)((long)&(local_e8->super_enable_shared_from_this<minja::Value>).
                                      _M_weak_this.
                                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr + lVar6);
        }
        std::__cxx11::string::substr((ulong)local_180,(ulong)local_160);
        Value::Value(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        std::__cxx11::string::~string(local_180);
        local_184 = 1;
        std::__cxx11::string::~string(local_160);
      }
      else {
        bVar1 = Value::is_array((Value *)0x2ff2c1);
        if (!bVar1) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          prVar3 = prVar8;
          bVar1 = Value::is_null((Value *)CONCAT17(in_stack_fffffffffffffbd7,
                                                   in_stack_fffffffffffffbd0));
          pcVar10 = "Subscripting only supported on arrays and strings";
          if (bVar1) {
            pcVar10 = "Cannot subscript null";
          }
          std::runtime_error::runtime_error(prVar3,pcVar10);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((long)local_88 < 0) {
          sVar7 = Value::size(local_3b0);
          local_88 = (Value *)((long)&(local_88->super_enable_shared_from_this<minja::Value>).
                                      _M_weak_this.
                                      super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_ptr + sVar7);
        }
        if ((long)local_e8 < 0) {
          in_stack_fffffffffffffc18 =
               (vector<minja::Value,_std::allocator<minja::Value>_> *)Value::size(local_3b0);
          local_e8 = (Value *)((long)&(in_stack_fffffffffffffc18->
                                      super__Vector_base<minja::Value,_std::allocator<minja::Value>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                              (long)&(local_e8->super_enable_shared_from_this<minja::Value>).
                                     _M_weak_this.
                                     super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
        }
        local_185 = 0;
        local_1a8 = 0;
        uStack_1a0 = 0;
        local_198 = 0;
        std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
                  ((vector<minja::Value,_std::allocator<minja::Value>_> *)0x2ff363);
        Value::array(in_stack_fffffffffffffc18);
        std::vector<minja::Value,_std::allocator<minja::Value>_>::~vector(in_stack_fffffffffffffbe0)
        ;
        for (local_1b0 = local_88; (long)local_1b0 < (long)local_e8;
            local_1b0 = (Value *)((long)&(local_1b0->super_enable_shared_from_this<minja::Value>).
                                         _M_weak_this.
                                         super___weak_ptr<minja::Value,_(__gnu_cxx::_Lock_policy)2>.
                                         _M_ptr + 1)) {
          Value::at(pVVar5,(size_t)in_stack_fffffffffffffc30);
          Value::push_back(in_stack_fffffffffffffc30,pVVar4);
        }
        local_184 = 1;
        local_185 = 1;
      }
    }
    Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
    return in_RDI;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"SubscriptExpr.index is null");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value do_evaluate(const std::shared_ptr<Context> & context) const override {
        if (!base) throw std::runtime_error("SubscriptExpr.base is null");
        if (!index) throw std::runtime_error("SubscriptExpr.index is null");
        auto target_value = base->evaluate(context);
        if (auto slice = dynamic_cast<SliceExpr*>(index.get())) {
          auto start = slice->start ? slice->start->evaluate(context).get<int64_t>() : 0;
          auto end = slice->end ? slice->end->evaluate(context).get<int64_t>() : (int64_t) target_value.size();
          if (target_value.is_string()) {
            std::string s = target_value.get<std::string>();
            if (start < 0) start = s.size() + start;
            if (end < 0) end = s.size() + end;
            return s.substr(start, end - start);
          } else if (target_value.is_array()) {
            if (start < 0) start = target_value.size() + start;
            if (end < 0) end = target_value.size() + end;
            auto result = Value::array();
            for (auto i = start; i < end; ++i) {
              result.push_back(target_value.at(i));
            }
            return result;
          } else {
            throw std::runtime_error(target_value.is_null() ? "Cannot subscript null" : "Subscripting only supported on arrays and strings");
          }
        } else {
          auto index_value = index->evaluate(context);
          if (target_value.is_null()) {
            if (auto t = dynamic_cast<VariableExpr*>(base.get())) {
              throw std::runtime_error("'" + t->get_name() + "' is " + (context->contains(t->get_name()) ? "null" : "not defined"));
            }
            throw std::runtime_error("Trying to access property '" +  index_value.dump() + "' on null!");
          }
          return target_value.get(index_value);
        }
    }